

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_cepstral_analysis.cc
# Opt level: O2

bool __thiscall
sptk::MelCepstralAnalysis::Run
          (MelCepstralAnalysis *this,vector<double,_std::allocator<double>_> *periodogram,
          vector<double,_std::allocator<double>_> *mel_cepstrum,Buffer *buffer)

{
  size_type __new_size;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *imag_part_output;
  vector<double,_std::allocator<double>_> *real_part_output;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  vector<double,_std::allocator<double>_> *this_03;
  vector<double,_std::allocator<double>_> *this_04;
  vector<double,_std::allocator<double>_> *real_part_output_00;
  int iVar1;
  double *pdVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  pointer pdVar6;
  double *pdVar7;
  int iVar8;
  size_type __new_size_00;
  long lVar9;
  size_t __n;
  pointer pdVar10;
  pointer __dest;
  long lVar11;
  size_type __new_size_01;
  double *pdVar12;
  int iVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  value_type_conflict local_38;
  
  iVar13 = this->fft_length_ / 2;
  if (this->is_valid_ == true) {
    if (buffer == (Buffer *)0x0) {
      return false;
    }
    if (mel_cepstrum == (vector<double,_std::allocator<double>_> *)0x0) {
      return false;
    }
    lVar11 = (long)(periodogram->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(periodogram->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
    __new_size_00 = lVar11 >> 3;
    uVar4 = iVar13 + 1;
    if (__new_size_00 != (long)(int)uVar4) {
      return false;
    }
    iVar1 = this->num_order_;
    lVar5 = (long)iVar1;
    __new_size = lVar5 + 1;
    if ((long)(mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(mel_cepstrum,__new_size);
    }
    if ((long)(buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)(buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start != lVar11) {
      std::vector<double,_std::allocator<double>_>::resize(&buffer->log_periodogram_,__new_size_00);
    }
    this_00 = &buffer->cepstrum_;
    if ((long)(buffer->cepstrum_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->cepstrum_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != (long)this->fft_length_) {
      std::vector<double,_std::allocator<double>_>::resize(this_00,(long)this->fft_length_);
    }
    this_01 = &buffer->rt_;
    iVar8 = (int)__new_size * 2 + -1;
    __new_size_01 = (size_type)iVar8;
    if ((long)(buffer->rt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->rt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != __new_size_01) {
      std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size_01);
    }
    this_02 = &buffer->rr_;
    if ((long)(buffer->rr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->rr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != __new_size_01) {
      std::vector<double,_std::allocator<double>_>::resize(this_02,__new_size_01);
    }
    this_03 = &buffer->ra_;
    if ((long)(buffer->ra_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->ra_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(this_03,__new_size);
    }
    this_04 = &buffer->gradient_;
    if ((long)(buffer->gradient_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->gradient_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(this_04,__new_size);
    }
    pdVar2 = (periodogram->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar10 = (buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start;
    for (pdVar7 = (periodogram->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start; pdVar7 != pdVar2; pdVar7 = pdVar7 + 1) {
      dVar15 = log(*pdVar7);
      *pdVar10 = dVar15;
      pdVar10 = pdVar10 + 1;
    }
    pdVar10 = (buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start;
    pdVar6 = (buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __dest = (buffer->cepstrum_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)pdVar6 - (long)pdVar10 != 0) {
      memmove(__dest,pdVar10,(long)pdVar6 - (long)pdVar10);
      pdVar10 = (buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pdVar6 = (buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      __dest = (buffer->cepstrum_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    lVar11 = (long)iVar13;
    pdVar7 = __dest + lVar11;
    while( true ) {
      pdVar7 = pdVar7 + 1;
      if (pdVar6 + -1 == pdVar10 + 1) break;
      *pdVar7 = pdVar6[-2];
      pdVar6 = pdVar6 + -1;
    }
    imag_part_output = &buffer->imag_part_output_;
    bVar3 = RealValuedInverseFastFourierTransform::Run
                      (&this->inverse_fourier_transform_,this_00,this_00,imag_part_output,
                       &buffer->buffer_for_inverse_fourier_transform_);
    if (bVar3) {
      pdVar7 = (buffer->cepstrum_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      *pdVar7 = *pdVar7 * 0.5;
      pdVar7[lVar11] = pdVar7[lVar11] * 0.5;
      std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size_00);
      bVar3 = FrequencyTransform::Run
                        (&this->frequency_transform_,this_00,mel_cepstrum,
                         &buffer->buffer_for_frequency_transform_);
      if (!bVar3) {
        return false;
      }
      real_part_output = &buffer->d_;
      real_part_output_00 = &buffer->r_;
      dVar15 = 1.79769313486232e+308;
      iVar13 = 0;
      while( true ) {
        if (this->num_iteration_ <= iVar13) {
          return true;
        }
        std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size_00);
        bVar3 = FrequencyTransform::Run
                          (&this->inverse_frequency_transform_,mel_cepstrum,this_00,
                           &buffer->buffer_for_inverse_frequency_transform_);
        if (!bVar3) break;
        local_38 = 0.0;
        std::vector<double,_std::allocator<double>_>::resize
                  (this_00,(long)this->fft_length_,&local_38);
        bVar3 = RealValuedFastFourierTransform::Run
                          (&this->fourier_transform_,this_00,real_part_output,imag_part_output,
                           &buffer->buffer_for_fourier_transform_);
        if (!bVar3) {
          return false;
        }
        pdVar2 = (buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pdVar12 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        for (pdVar7 = (buffer->log_periodogram_).super__Vector_base<double,_std::allocator<double>_>
                      ._M_impl.super__Vector_impl_data._M_start; pdVar7 != pdVar2;
            pdVar7 = pdVar7 + 1) {
          dVar16 = exp((*pdVar7 - *pdVar12) - *pdVar12);
          *pdVar12 = dVar16;
          pdVar12 = pdVar12 + 1;
        }
        pdVar10 = (real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar6 = pdVar10 + lVar11 + 1;
        for (lVar9 = lVar11 << 3; lVar9 != 8; lVar9 = lVar9 + -8) {
          *pdVar6 = *(double *)((long)pdVar10 + lVar9 + -8);
          pdVar6 = pdVar6 + 1;
        }
        bVar3 = RealValuedInverseFastFourierTransform::Run
                          (&this->inverse_fourier_transform_,real_part_output,real_part_output_00,
                           imag_part_output,&buffer->buffer_for_inverse_fourier_transform_);
        if (!bVar3) {
          return false;
        }
        dVar16 = this->alpha_;
        if ((long)(buffer->rt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(buffer->rt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3 != __new_size_01) {
          std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size_01);
        }
        if ((dVar16 != 0.0) || (NAN(dVar16))) {
          pdVar7 = (buffer->b_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((long)(buffer->b_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar7 >> 3 != __new_size_01) {
            std::vector<double,_std::allocator<double>_>::resize(&buffer->b_,__new_size_01);
            pdVar7 = (buffer->b_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          }
          pdVar10 = (real_part_output_00->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar6 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          for (lVar9 = 0; uVar14 = (ulong)uVar4, (long)(iVar1 * 2) * 8 + 8 != lVar9;
              lVar9 = lVar9 + 8) {
            *(undefined8 *)((long)pdVar6 + lVar9) = 0;
          }
          while (0 < (int)uVar14) {
            uVar14 = uVar14 - 1;
            *pdVar7 = *pdVar6;
            *pdVar6 = pdVar10[uVar14];
            for (lVar9 = 1; lVar9 < (long)__new_size_01; lVar9 = lVar9 + 1) {
              dVar17 = pdVar6[lVar9];
              pdVar7[lVar9] = dVar17;
              pdVar6[lVar9] = (dVar17 - pdVar6[lVar9 + -1]) * dVar16 + pdVar7[lVar9 + -1];
            }
          }
        }
        else {
          pdVar10 = (real_part_output_00->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if ((int)uVar4 < iVar8) {
            pdVar6 = (buffer->rt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            __n = (long)(buffer->r_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar10;
            if (__n != 0) {
              memmove(pdVar6,pdVar10,__n);
              pdVar6 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
            }
            pdVar10 = (buffer->rt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            for (pdVar6 = pdVar6 + __new_size_00; pdVar6 != pdVar10; pdVar6 = pdVar6 + 1) {
              *pdVar6 = 0.0;
            }
          }
          else {
            memmove((this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start,pdVar10,__new_size_01 * 8);
          }
        }
        pdVar7 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar16 = *pdVar7;
        dVar17 = ABS((dVar16 - dVar15) / dVar16);
        if (dVar17 < this->convergence_threshold_) {
          return true;
        }
        uVar14 = -(ulong)(this->convergence_threshold_ <= dVar17);
        dVar15 = (double)(~uVar14 & (ulong)dVar15 | (ulong)dVar16 & uVar14);
        pdVar10 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar6 = pdVar10;
        for (lVar9 = lVar5 << 3; lVar9 != 0; lVar9 = lVar9 + -8) {
          *pdVar6 = *(double *)((long)pdVar7 + lVar9);
          pdVar6 = pdVar6 + 1;
        }
        if ((int)__new_size != 0) {
          memmove(pdVar10 + lVar5,pdVar7,__new_size * 8);
        }
        pdVar10 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        std::
        transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::minus<double>>
                  (pdVar10,pdVar10 + __new_size,
                   (this->alpha_vector_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start,
                   (this_03->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start);
        bVar3 = ToeplitzPlusHankelSystemSolver::Run
                          (&this->toeplitz_plus_hankel_system_solver_,this_02,this_01,this_03,
                           this_04,&buffer->buffer_for_system_solver_);
        if (!bVar3) {
          return false;
        }
        std::
        transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::plus<double>>
                  ((mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start,
                   (mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish,
                   (this_04->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start);
        iVar13 = iVar13 + 1;
      }
    }
  }
  return false;
}

Assistant:

bool MelCepstralAnalysis::Run(const std::vector<double>& periodogram,
                              std::vector<double>* mel_cepstrum,
                              MelCepstralAnalysis::Buffer* buffer) const {
  // Check inputs.
  const int half_fft_length(fft_length_ / 2);
  if (!is_valid_ ||
      periodogram.size() != static_cast<std::size_t>(half_fft_length + 1) ||
      NULL == mel_cepstrum || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int length(num_order_ + 1);
  if (mel_cepstrum->size() != static_cast<std::size_t>(length)) {
    mel_cepstrum->resize(length);
  }
  if (buffer->log_periodogram_.size() !=
      static_cast<std::size_t>(half_fft_length + 1)) {
    buffer->log_periodogram_.resize(half_fft_length + 1);
  }
  if (buffer->cepstrum_.size() != static_cast<std::size_t>(fft_length_)) {
    buffer->cepstrum_.resize(fft_length_);
  }
  if (buffer->rt_.size() != static_cast<std::size_t>(2 * length - 1)) {
    buffer->rt_.resize(2 * length - 1);
  }
  if (buffer->rr_.size() != static_cast<std::size_t>(2 * length - 1)) {
    buffer->rr_.resize(2 * length - 1);
  }
  if (buffer->ra_.size() != static_cast<std::size_t>(length)) {
    buffer->ra_.resize(length);
  }
  if (buffer->gradient_.size() != static_cast<std::size_t>(length)) {
    buffer->gradient_.resize(length);
  }

  // Make an initial guess.
  {
    std::transform(periodogram.begin(), periodogram.end(),
                   buffer->log_periodogram_.begin(),
                   [](double p) { return std::log(p); });

    // \log I_N -> c
    std::copy(buffer->log_periodogram_.begin(), buffer->log_periodogram_.end(),
              buffer->cepstrum_.begin());
    std::reverse_copy(buffer->log_periodogram_.begin() + 1,
                      buffer->log_periodogram_.end() - 1,
                      buffer->cepstrum_.begin() + half_fft_length + 1);
    if (!inverse_fourier_transform_.Run(
            buffer->cepstrum_, &buffer->cepstrum_, &buffer->imag_part_output_,
            &buffer->buffer_for_inverse_fourier_transform_)) {
      return false;
    }
    buffer->cepstrum_[0] *= 0.5;
    buffer->cepstrum_[half_fft_length] *= 0.5;

    // c -> \tilde{c}
    buffer->cepstrum_.resize(half_fft_length + 1);
    if (!frequency_transform_.Run(buffer->cepstrum_, mel_cepstrum,
                                  &buffer->buffer_for_frequency_transform_)) {
      return false;
    }
  }

  // Perform Newton-Raphson method.
  double prev_epsilon(sptk::kMax);
  for (int n(0); n < num_iteration_; ++n) {
    // \tilde{c} -> c
    buffer->cepstrum_.resize(half_fft_length + 1);
    if (!inverse_frequency_transform_.Run(
            *mel_cepstrum, &buffer->cepstrum_,
            &buffer->buffer_for_inverse_frequency_transform_)) {
      return false;
    }

    // c -> \log D
    buffer->cepstrum_.resize(fft_length_, 0.0);
    if (!fourier_transform_.Run(buffer->cepstrum_, &buffer->d_,
                                &buffer->imag_part_output_,
                                &buffer->buffer_for_fourier_transform_)) {
      return false;
    }

    // \log D -> I_N / |D|^2
    std::transform(buffer->log_periodogram_.begin(),
                   buffer->log_periodogram_.end(), buffer->d_.begin(),
                   buffer->d_.begin(),
                   [](double x, double d) { return std::exp(x - d - d); });
    std::reverse_copy(buffer->d_.begin() + 1,
                      buffer->d_.begin() + half_fft_length,
                      buffer->d_.begin() + half_fft_length + 1);

    // I_N / |D|^2 -> r
    if (!inverse_fourier_transform_.Run(
            buffer->d_, &buffer->r_, &buffer->imag_part_output_,
            &buffer->buffer_for_inverse_fourier_transform_)) {
      return false;
    }

    // r -> \tilde{r}
    CoefficientsFrequencyTransform(buffer->r_, half_fft_length + 1,
                                   2 * length - 1, alpha_, &buffer->rt_,
                                   &buffer->b_);

    // Check convergence.
    // (Note that the check can be done after updating mel-cepstrum, but to
    // retain the compatibility with SPTK3, this block is written here)
    {
      const double epsilon(buffer->rt_[0]);
      const double relative_change((epsilon - prev_epsilon) / epsilon);
      if (std::fabs(relative_change) < convergence_threshold_) {
        break;
      }
      prev_epsilon = epsilon;
    }

    // \tilde{r} -> R
    std::reverse_copy(buffer->rt_.begin() + 1, buffer->rt_.begin() + length,
                      buffer->rr_.begin());
    std::copy(buffer->rt_.begin(), buffer->rt_.begin() + length,
              buffer->rr_.begin() + length - 1);

    // \tilde{r} -> \tilde{r} - a
    std::transform(buffer->rt_.begin(), buffer->rt_.begin() + length,
                   alpha_vector_.begin(), buffer->ra_.begin(),
                   std::minus<double>());

    // Compute \Delta \tilde{c}.
    if (!toeplitz_plus_hankel_system_solver_.Run(
            buffer->rr_, buffer->rt_, buffer->ra_, &buffer->gradient_,
            &buffer->buffer_for_system_solver_)) {
      return false;
    }

    // Update \tilde{c}.
    std::transform(mel_cepstrum->begin(), mel_cepstrum->end(),
                   buffer->gradient_.begin(), mel_cepstrum->begin(),
                   std::plus<double>());
  }

  return true;
}